

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk60(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  uint offs;
  int iVar3;
  int iVar4;
  int iVar5;
  envy_bios_power_unk60_entry *peVar6;
  ulong uVar7;
  
  offs = (bios->power).unk60.offset;
  iVar3 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk60.version);
    uVar1 = (bios->power).unk60.version;
    if ((uVar1 == ' ') || (uVar1 == '\x10')) {
      iVar3 = bios_u8(bios,(bios->power).unk60.offset + 1,&(bios->power).unk60.hlen);
      iVar4 = bios_u8(bios,(bios->power).unk60.offset + 2,&(bios->power).unk60.rlen);
      iVar5 = bios_u8(bios,(bios->power).unk60.offset + 3,&(bios->power).unk60.entriesnum);
      (bios->power).unk60.valid = iVar5 == 0 && (iVar4 == 0 && iVar3 == 0);
      bVar2 = (bios->power).unk60.entriesnum;
      peVar6 = (envy_bios_power_unk60_entry *)malloc((ulong)bVar2 << 2);
      (bios->power).unk60.entries = peVar6;
      iVar3 = 0;
      for (uVar7 = 0; bVar2 != uVar7; uVar7 = uVar7 + 1) {
        peVar6[uVar7].offset =
             (uint)(bios->power).unk60.rlen * (int)uVar7 +
             (uint)(bios->power).unk60.hlen + (bios->power).unk60.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown DI/DT table version 0x%x\n");
    }
  }
  return iVar3;
}

Assistant:

int envy_bios_parse_power_unk60(struct envy_bios *bios) {
	struct envy_bios_power_unk60 *unk60 = &bios->power.unk60;
	int i, err = 0;

	if (!unk60->offset)
		return -EINVAL;

	bios_u8(bios, unk60->offset + 0x0, &unk60->version);
	switch(unk60->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, unk60->offset + 0x1, &unk60->hlen);
		err |= bios_u8(bios, unk60->offset + 0x2, &unk60->rlen);
		err |= bios_u8(bios, unk60->offset + 0x3, &unk60->entriesnum);
		unk60->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown DI/DT table version 0x%x\n", unk60->version);
		return -EINVAL;
	};

	err = 0;
	unk60->entries = malloc(unk60->entriesnum * sizeof(struct envy_bios_power_unk60_entry));
	for (i = 0; i < unk60->entriesnum; i++) {
		uint32_t data = unk60->offset + unk60->hlen + i * unk60->rlen;

		unk60->entries[i].offset = data;
	}

	return 0;
}